

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplayingHammerer.cpp
# Opt level: O3

size_t __thiscall
ReplayingHammerer::hammer_pattern
          (ReplayingHammerer *this,FuzzingParameterSet *fuzz_params,CodeJitter *code_jitter,
          HammeringPattern *pattern,PatternAddressMapper *mapper,FLUSHING_STRATEGY flushing_strategy
          ,FENCING_STRATEGY fencing_strategy,unsigned_long num_reps,int aggressors_for_sync,
          int num_activations,bool early_stopping,bool sync_each_ref,bool verbose_sync,
          bool verbose_memcheck,bool verbose_params,bool wait_before_hammering,
          bool check_flips_after_each_rep,
          vector<volatile_char_*,_std::allocator<volatile_char_*>_> *hammering_accesses_vec)

{
  Memory *pMVar1;
  pointer pBVar2;
  int wait_until_hammering_us;
  int row_upper_bound;
  size_t sVar3;
  pointer ctx;
  ulong uVar4;
  undefined1 local_b0 [8];
  vector<volatile_char_*,_std::allocator<volatile_char_*>_> random_rows;
  size_t local_78;
  ulong local_70;
  pointer pBStack_58;
  vector<BitFlip,_std::allocator<BitFlip>_> flipped_bits_acc;
  
  PatternAddressMapper::determine_victims(mapper,&pattern->agg_access_patterns);
  CodeJitter::jit_strict
            (code_jitter,pattern->total_activations / pattern->num_refresh_intervals,
             flushing_strategy,fencing_strategy,hammering_accesses_vec,sync_each_ref,
             aggressors_for_sync,num_activations);
  pBStack_58 = (pointer)0x0;
  flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (num_reps == 0) {
    last_reproducibility_score = 0.0;
    flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pBStack_58 = (pointer)0x0;
    local_78 = 0;
  }
  else {
    random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(2 - num_reps);
    uVar4 = 1;
    local_70 = 0;
    local_78 = 0;
    do {
      wait_until_hammering_us =
           FuzzingParameterSet::get_random_wait_until_start_hammering_us(fuzz_params);
      if (verbose_params) {
        FuzzingParameterSet::print_dynamic_parameters2
                  (sync_each_ref,wait_until_hammering_us,aggressors_for_sync);
      }
      if (0 < wait_until_hammering_us && wait_before_hammering) {
        row_upper_bound = FuzzingParameterSet::get_max_row_no(fuzz_params);
        PatternAddressMapper::get_random_nonaccessed_rows
                  ((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_b0,mapper,
                   row_upper_bound);
        FuzzyHammerer::do_random_accesses
                  ((vector<volatile_char_*,_std::allocator<volatile_char_*>_> *)local_b0,
                   wait_until_hammering_us);
        if (local_b0 != (undefined1  [8])0x0) {
          operator_delete((void *)local_b0,
                          (long)random_rows.
                                super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)local_b0);
        }
      }
      CodeJitter::hammer_pattern(code_jitter,fuzz_params,verbose_sync);
      if ((long)random_rows.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage + uVar4 == 1 ||
          check_flips_after_each_rep) {
        sVar3 = Memory::check_memory(this->mem,mapper,true,verbose_memcheck);
        std::vector<BitFlip,std::allocator<BitFlip>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<BitFlip*,std::vector<BitFlip,std::allocator<BitFlip>>>>
                  ((vector<BitFlip,std::allocator<BitFlip>> *)&pBStack_58,
                   flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (this->mem->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (this->mem->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        local_70 = local_70 + (sVar3 != 0);
        local_78 = local_78 + sVar3;
        if (early_stopping && sVar3 != 0) break;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 <= num_reps);
    last_reproducibility_score = (double)(int)(local_70 / uVar4);
  }
  pMVar1 = this->mem;
  pBVar2 = (pMVar1->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
           super__Vector_impl_data._M_start;
  ctx = (pMVar1->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  (pMVar1->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
  super__Vector_impl_data._M_start = pBStack_58;
  (pMVar1->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
  super__Vector_impl_data._M_finish =
       flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pMVar1->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pBStack_58 = (pointer)0x0;
  flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pBVar2 != (pointer)0x0) {
    ctx = (pointer)((long)ctx - (long)pBVar2);
    operator_delete(pBVar2,(ulong)ctx);
  }
  CodeJitter::cleanup(code_jitter,(EVP_PKEY_CTX *)ctx);
  if (pBStack_58 != (pointer)0x0) {
    operator_delete(pBStack_58,
                    (long)flipped_bits_acc.super__Vector_base<BitFlip,_std::allocator<BitFlip>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pBStack_58);
  }
  return local_78;
}

Assistant:

size_t ReplayingHammerer::hammer_pattern(FuzzingParameterSet &fuzz_params, CodeJitter &code_jitter,
                                         HammeringPattern &pattern, PatternAddressMapper &mapper,
                                         FLUSHING_STRATEGY flushing_strategy, FENCING_STRATEGY fencing_strategy,
                                         unsigned long num_reps, int aggressors_for_sync,
                                         int num_activations, bool early_stopping, bool sync_each_ref,
                                         bool verbose_sync, bool verbose_memcheck, bool verbose_params,
                                         bool wait_before_hammering, bool check_flips_after_each_rep,
                                         std::vector<volatile char*> &hammering_accesses_vec) {

  // early_stopping: stop after the first repetition in that we observe any bit flips

  size_t reps_with_bitflips = 0;
  size_t total_bitflips_all_reps = 0;

  // load victims for memory check
  mapper.determine_victims(pattern.agg_access_patterns);

  // create instructions that follow this pattern (i.e., do jitting of code)
  auto const acts_per_tref = static_cast<int>(pattern.total_activations/pattern.num_refresh_intervals);
  code_jitter.jit_strict(acts_per_tref, flushing_strategy, fencing_strategy, hammering_accesses_vec, sync_each_ref,
      aggressors_for_sync, num_activations);

  // dirty hack to get correct output of flipped rows as we need to aggregate the results over all tries
  std::vector<BitFlip> flipped_bits_acc;

  // note: we start counting the num_tries by 1, otherwise reps_with_bitflips/num_tries may cause a division-by-zero
  size_t num_tries = 1;
  for (; num_tries <= num_reps; num_tries++) {
    // wait a specific time while doing some random accesses before starting hammering
    auto wait_until_hammering_us = fuzz_params.get_random_wait_until_start_hammering_us();

    if (verbose_params) {
      FuzzingParameterSet::print_dynamic_parameters2(sync_each_ref, wait_until_hammering_us, aggressors_for_sync);
    }

    if (wait_before_hammering && wait_until_hammering_us > 0) {
      std::vector<volatile char *> random_rows = mapper.get_random_nonaccessed_rows(fuzz_params.get_max_row_no());
      FuzzyHammerer::do_random_accesses(random_rows, wait_until_hammering_us);
    }

    // do hammering
    code_jitter.hammer_pattern(fuzz_params, verbose_sync);

    // check for bit flips if check_flips_after_each_rep=true or if we're in the last iteration
    if (check_flips_after_each_rep || num_tries==num_reps - 1) {
      // check if any bit flips happened
      // it's important that we run in reproducibility mode, otherwise the bit flips vec in the mapping is changed!
      auto num_bitflips = mem.check_memory(mapper, true, verbose_memcheck);
      total_bitflips_all_reps += num_bitflips;
      reps_with_bitflips += (num_bitflips > 0);
      flipped_bits_acc.insert(flipped_bits_acc.end(), mem.flipped_bits.begin(), mem.flipped_bits.end());

      // in early_stopping mode, we do not carry out all repetitions but stop after we have found at least one bit flip
      if (num_bitflips > 0 && early_stopping) break;
    }
  }

  ReplayingHammerer::last_reproducibility_score = (int) std::ceil(reps_with_bitflips/num_tries);

  mem.flipped_bits = std::move(flipped_bits_acc);

  code_jitter.cleanup();

  return total_bitflips_all_reps;
}